

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O0

void __thiscall
ObjectInfoCollection::RemoveObject
          (ObjectInfoCollection *this,uint64_t object_handle,XrObjectType object_type)

{
  anon_class_16_2_f0d54a3b_for__M_pred local_30;
  XrObjectType local_1c;
  uint64_t uStack_18;
  XrObjectType object_type_local;
  uint64_t object_handle_local;
  ObjectInfoCollection *this_local;
  
  local_30.object_handle = object_handle;
  local_30.object_type = object_type;
  local_1c = object_type;
  uStack_18 = object_handle;
  object_handle_local = (uint64_t)this;
  vector_remove_if_and_erase<XrSdkLogObjectInfo,std::allocator<XrSdkLogObjectInfo>,ObjectInfoCollection::RemoveObject(unsigned_long,XrObjectType)::__0>
            (&this->object_info_,&local_30);
  return;
}

Assistant:

void ObjectInfoCollection::RemoveObject(uint64_t object_handle, XrObjectType object_type) {
    vector_remove_if_and_erase(
        object_info_, [=](XrSdkLogObjectInfo const& info) { return info.handle == object_handle && info.type == object_type; });
}